

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::shiftDown(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            *this,size_t idx)

{
  uint8_t *puVar1;
  long lVar2;
  
  lVar2 = idx * 0x58;
  while( true ) {
    puVar1 = this->mInfo;
    if ((uint)puVar1[idx + 1] < this->mInfoInc * 2) break;
    puVar1[idx] = puVar1[idx + 1] - (char)this->mInfoInc;
    pair<Rml::PropertyId,_Rml::Property>::operator=
              ((pair<Rml::PropertyId,_Rml::Property> *)
               ((this->mKeyVals->mData).second.value.data + lVar2 + -0x10),
               (pair<Rml::PropertyId,_Rml::Property> *)
               (this->mKeyVals[1].mData.second.value.data + lVar2 + -0x10));
    lVar2 = lVar2 + 0x58;
    idx = idx + 1;
  }
  puVar1[idx] = '\0';
  Rml::Property::~Property((Property *)((this->mKeyVals->mData).second.value.data + lVar2 + -8));
  return;
}

Assistant:

void shiftDown(size_t idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        // until we find one that is either empty or has zero offset.
        // TODO(martinus) we don't need to move everything, just the last one for the same
        // bucket.
        mKeyVals[idx].destroy(*this);

        // until we find one that is either empty or has zero offset.
        while (mInfo[idx + 1] >= 2 * mInfoInc) {
            ROBIN_HOOD_COUNT(shiftDown)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx + 1] - mInfoInc);
            mKeyVals[idx] = std::move(mKeyVals[idx + 1]);
            ++idx;
        }

        mInfo[idx] = 0;
        // don't destroy, we've moved it
        // mKeyVals[idx].destroy(*this);
        mKeyVals[idx].~Node();
    }